

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_field.h
# Opt level: O1

void __thiscall
google::protobuf::internal::RepeatedPtrFieldBase::
SwapFallback<google::protobuf::RepeatedPtrField<google::protobuf::Message>::TypeHandler>
          (RepeatedPtrFieldBase *this,RepeatedPtrFieldBase *other)

{
  Rep *pRVar1;
  undefined8 uVar2;
  void **ppvVar3;
  int iVar4;
  long lVar5;
  RepeatedPtrFieldBase local_48;
  
  local_48.arena_ = other->arena_;
  local_48.current_size_ = 0;
  local_48.total_size_ = 0;
  local_48.rep_ = (Rep *)0x0;
  iVar4 = this->current_size_;
  if (iVar4 != 0) {
    pRVar1 = this->rep_;
    ppvVar3 = InternalExtend(&local_48,iVar4);
    MergeFromInnerLoop<google::protobuf::RepeatedPtrField<google::protobuf::Message>::TypeHandler>
              (&local_48,ppvVar3,pRVar1->elements,iVar4,
               (local_48.rep_)->allocated_size - local_48.current_size_);
    iVar4 = iVar4 + local_48.current_size_;
    local_48.current_size_ = iVar4;
    if ((local_48.rep_)->allocated_size < iVar4) {
      (local_48.rep_)->allocated_size = iVar4;
    }
  }
  iVar4 = this->current_size_;
  if (0 < (long)iVar4) {
    pRVar1 = this->rep_;
    lVar5 = 0;
    do {
      ppvVar3 = pRVar1->elements + lVar5;
      lVar5 = lVar5 + 1;
      (**(code **)(**ppvVar3 + 0x38))();
    } while (iVar4 != lVar5);
    this->current_size_ = 0;
  }
  iVar4 = other->current_size_;
  if (iVar4 != 0) {
    pRVar1 = other->rep_;
    ppvVar3 = InternalExtend(this,iVar4);
    MergeFromInnerLoop<google::protobuf::RepeatedPtrField<google::protobuf::Message>::TypeHandler>
              (this,ppvVar3,pRVar1->elements,iVar4,this->rep_->allocated_size - this->current_size_)
    ;
    iVar4 = iVar4 + this->current_size_;
    this->current_size_ = iVar4;
    if (this->rep_->allocated_size < iVar4) {
      this->rep_->allocated_size = iVar4;
    }
  }
  iVar4 = other->current_size_;
  if (0 < (long)iVar4) {
    pRVar1 = other->rep_;
    lVar5 = 0;
    do {
      ppvVar3 = pRVar1->elements + lVar5;
      lVar5 = lVar5 + 1;
      (**(code **)(**ppvVar3 + 0x38))();
    } while (iVar4 != lVar5);
    other->current_size_ = 0;
  }
  pRVar1 = other->rep_;
  other->rep_ = local_48.rep_;
  uVar2._0_4_ = other->current_size_;
  uVar2._4_4_ = other->total_size_;
  other->current_size_ = local_48.current_size_;
  other->total_size_ = local_48.total_size_;
  local_48._8_8_ = uVar2;
  local_48.rep_ = pRVar1;
  Destroy<google::protobuf::RepeatedPtrField<google::protobuf::Message>::TypeHandler>(&local_48);
  return;
}

Assistant:

void RepeatedPtrFieldBase::SwapFallback(RepeatedPtrFieldBase* other) {
  GOOGLE_DCHECK(other->GetArenaNoVirtual() != GetArenaNoVirtual());

  // Copy semantics in this case. We try to improve efficiency by placing the
  // temporary on |other|'s arena so that messages are copied cross-arena only
  // once, not twice.
  RepeatedPtrFieldBase temp(other->GetArenaNoVirtual());
  temp.MergeFrom<TypeHandler>(*this);
  this->Clear<TypeHandler>();
  this->MergeFrom<TypeHandler>(*other);
  other->Clear<TypeHandler>();
  other->InternalSwap(&temp);
  temp.Destroy<TypeHandler>();  // Frees rep_ if `other` had no arena.
}